

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_280db::ArenaTest_FuzzFuseFuseRace_Test::TestBody
          (ArenaTest_FuzzFuseFuseRace_Test *this)

{
  bool bVar1;
  Time TVar2;
  Duration rhs;
  Time lhs;
  thread *t;
  iterator __end1;
  iterator __begin1;
  vector<std::thread,_std::allocator<std::thread>_> *__range1;
  HiRep local_840;
  uint32_t local_838;
  Time end;
  BitGen gen;
  int local_694;
  undefined1 local_690 [4];
  int i;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  undefined1 local_668 [8];
  Notification done;
  Environment env;
  ArenaTest_FuzzFuseFuseRace_Test *this_local;
  
  Environment::Environment((Environment *)&done.notified_yet_);
  absl::lts_20250127::Notification::Notification((Notification *)local_668);
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)local_690);
  for (local_694 = 0; local_694 < 10; local_694 = local_694 + 1) {
    gen.urbg_.impl_._8_8_ = local_668;
    std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<(anonymous_namespace)::ArenaTest_FuzzFuseFuseRace_Test::TestBody()::__0>
              ((vector<std::thread,std::allocator<std::thread>> *)local_690,
               (type *)&gen.urbg_.impl_.has_crypto_);
  }
  absl::lts_20250127::random_internal::
  NonsecureURBGBase<absl::lts_20250127::random_internal::randen_engine<unsigned_long>,_absl::lts_20250127::random_internal::RandenPoolSeedSeq>
  ::NonsecureURBGBase((NonsecureURBGBase<absl::lts_20250127::random_internal::randen_engine<unsigned_long>,_absl::lts_20250127::random_internal::RandenPoolSeedSeq>
                       *)&end.rep_.rep_hi_.hi_);
  TVar2 = absl::lts_20250127::Now();
  rhs = absl::lts_20250127::Seconds<int,_0>(2);
  TVar2 = absl::lts_20250127::operator+(TVar2,rhs);
  local_840 = TVar2.rep_.rep_hi_;
  local_838 = TVar2.rep_.rep_lo_;
  end.rep_.rep_hi_.lo_ = local_838;
  while( true ) {
    lhs = absl::lts_20250127::Now();
    TVar2.rep_.rep_lo_ = end.rep_.rep_hi_.lo_;
    TVar2.rep_.rep_hi_ = local_840;
    bVar1 = absl::lts_20250127::operator<(lhs,TVar2);
    if (!bVar1) break;
    Environment::RandomFuse((Environment *)&done.notified_yet_,(BitGen *)&end.rep_.rep_hi_.hi_);
  }
  absl::lts_20250127::Notification::Notify((Notification *)local_668);
  __end1 = std::vector<std::thread,_std::allocator<std::thread>_>::begin
                     ((vector<std::thread,_std::allocator<std::thread>_> *)local_690);
  t = (thread *)
      std::vector<std::thread,_std::allocator<std::thread>_>::end
                ((vector<std::thread,_std::allocator<std::thread>_> *)local_690);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                                *)&t);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator*(&__end1);
    std::thread::join();
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator++(&__end1);
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)local_690);
  absl::lts_20250127::Notification::~Notification((Notification *)local_668);
  Environment::~Environment((Environment *)&done.notified_yet_);
  return;
}

Assistant:

TEST(ArenaTest, FuzzFuseFuseRace) {
  Environment env;

  absl::Notification done;
  std::vector<std::thread> threads;
  for (int i = 0; i < 10; ++i) {
    threads.emplace_back([&]() {
      absl::BitGen gen;
      while (!done.HasBeenNotified()) {
        env.RandomFuse(gen);
      }
    });
  }

  absl::BitGen gen;
  auto end = absl::Now() + absl::Seconds(2);
  while (absl::Now() < end) {
    env.RandomFuse(gen);
  }
  done.Notify();
  for (auto& t : threads) t.join();
}